

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcCrossProducts
          (BeagleCPUImpl<double,_1,_1> *this,int *postBufferIndices,int *preBufferIndices,
          int *categoryRatesIndices,int *categoryWeightsIndices,double *edgeLengths,int count,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  void *pvVar6;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int *in_R8;
  long in_R9;
  int in_stack_00000008;
  double *postOrderPartial;
  int patternOffset;
  int scalingFactorsIndex;
  int *tipStates;
  double *preOrderPartial;
  double edgeLength;
  int nodeNum;
  double *categoryWeights;
  double *categoryRates;
  int secondDerivativeIndex;
  int returnCode;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_4c;
  
  uVar2 = *(undefined8 *)(in_RDI[0xf] + (long)*in_RCX * 8);
  uVar3 = *(undefined8 *)(in_RDI[0x14] + (long)*in_R8 * 8);
  if (in_RDI[0x21] == 0) {
    pvVar6 = mallocAligned((BeagleCPUImpl<double,_1,_1> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
    in_RDI[0x21] = (long)pvVar6;
  }
  for (local_4c = 0; local_4c < in_stack_00000008; local_4c = local_4c + 1) {
    uVar1 = *(undefined8 *)(in_R9 + (long)local_4c * 8);
    uVar4 = *(undefined8 *)(in_RDI[0x16] + (long)*(int *)(in_RDX + (long)local_4c * 4) * 8);
    lVar5 = *(long *)(in_RDI[0x17] + (long)*(int *)(in_RSI + (long)local_4c * 4) * 8);
    if (lVar5 == 0) {
      (**(code **)(*in_RDI + 0x1d8))
                (uVar1,in_RDI,
                 *(undefined8 *)(in_RDI[0x16] + (long)*(int *)(in_RSI + (long)local_4c * 4) * 8),
                 uVar4,uVar2,uVar3,postOrderPartial,_patternOffset);
    }
    else {
      (**(code **)(*in_RDI + 0x1d0))
                (uVar1,in_RDI,lVar5,uVar4,uVar2,uVar3,postOrderPartial,_patternOffset);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProducts(const int *postBufferIndices,
                                                         const int *preBufferIndices,
                                                         const int *categoryRatesIndices,
                                                         const int *categoryWeightsIndices,
                                                         const double *edgeLengths,
                                                         int count,
                                                         double *outSumDerivatives,
                                                         double *outSumSquaredDerivatives) {

    int returnCode = BEAGLE_SUCCESS;

    const int secondDerivativeIndex = BEAGLE_OP_NONE;
    const double *categoryRates = gCategoryRates[categoryRatesIndices[0]]; // TODO Generalize
    const REALTYPE *categoryWeights = gCategoryWeights[categoryWeightsIndices[0]]; // TODO Generalize

    if (crossProductNumeratorTmp == nullptr) {
        crossProductNumeratorTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount
                * kStateCount * kStateCount);
    }

//    std::fill(outCrossProducts, outCrossProducts + kStateCount * kStateCount, 0.0); // TODO Remove

    for (int nodeNum = 0; nodeNum < count; nodeNum++) {

        const double edgeLength = edgeLengths[nodeNum];

        const REALTYPE *preOrderPartial = gPartials[preBufferIndices[nodeNum]];
        const int *tipStates = gTipStates[postBufferIndices[nodeNum]];

//        const int firstDerivativeIndex = firstDerivativeIndices[nodeNum];
        const int scalingFactorsIndex = -1; // cumulativeScaleIndices[nodeNum];

        const int patternOffset = nodeNum * kPatternCount;
//        double* outDerivativesForNode = (outDerivatives == NULL) ?
//                NULL : outDerivatives + patternOffset;
//        double* outSumDerivativesForNode = (outSumDerivatives == NULL) ?
//                NULL : outSumDerivatives + nodeNum;
//        double* outSumSquaredDerivativesForNode = (outSumSquaredDerivatives == NULL) ?
//                NULL : outSumSquaredDerivatives + nodeNum;
//
//        resetDerivativeTemporaries();
//
        if (tipStates != NULL) {

            calcCrossProductsStates(tipStates, preOrderPartial,
                                    categoryRates,
                                    categoryWeights,
                                    edgeLength,
                                    outSumDerivatives,
                                    outSumSquaredDerivatives);

        } else {

            const REALTYPE *postOrderPartial = gPartials[postBufferIndices[nodeNum]];
            calcCrossProductsPartials(postOrderPartial, preOrderPartial,
                                      categoryRates,
                                      categoryWeights,
                                      edgeLength,
                                      outSumDerivatives,
                                      outSumSquaredDerivatives);
        }
//
//        accumulateDerivatives(outDerivativesForNode,
//                outSumDerivativesForNode,
//                outSumSquaredDerivativesForNode);

//        std::cout << "A: " << outCrossProducts[0] << std::endl;
//        std::fill(outCrossProducts, outCrossProducts + kStateCount * kStateCount, 0.0); // TODO Remove

    }

    return returnCode;
}